

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O0

int __thiscall wasm::SExpressionWasmBuilder::parseIndex(SExpressionWasmBuilder *this,Element *s)

{
  int iVar1;
  string local_38;
  Element *local_18;
  Element *s_local;
  SExpressionWasmBuilder *this_local;
  
  local_18 = s;
  s_local = (Element *)this;
  Element::toString_abi_cxx11_(&local_38,s);
  iVar1 = std::__cxx11::stoi(&local_38,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar1;
}

Assistant:

int SExpressionWasmBuilder::parseIndex(Element& s) {
  try {
    return std::stoi(s.toString());
  } catch (...) {
    throw ParseException("expected integer", s.line, s.col);
  }
}